

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_call(lua_State *L,StkId func,int nResults)

{
  int nResults_local;
  StkId func_local;
  lua_State *L_local;
  
  ccall(L,func,nResults,1);
  return;
}

Assistant:

void luaD_call (lua_State *L, StkId func, int nResults) {
  ccall(L, func, nResults, 1);
}